

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O2

TPZEigenSolver<std::complex<double>_> * __thiscall
TPZEigenAnalysis::EigenSolver<std::complex<double>>(TPZEigenAnalysis *this)

{
  TPZEigenSolver<std::complex<double>_> *pTVar1;
  
  pTVar1 = (TPZEigenSolver<std::complex<double>_> *)
           __dynamic_cast((this->super_TPZAnalysis).fSolver,&TPZSolver::typeinfo,
                          &TPZEigenSolver<std::complex<double>>::typeinfo,0);
  if (pTVar1 != (TPZEigenSolver<std::complex<double>_> *)0x0) {
    return pTVar1;
  }
  std::operator<<((ostream *)&std::cerr,
                  "TPZEigenSolver<TVar> &TPZEigenAnalysis::EigenSolver() [TVar = std::complex<double>]"
                 );
  std::operator<<((ostream *)&std::cerr," incompatible Solver type! Aborting\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/TPZEigenAnalysis.cpp"
             ,0x33);
}

Assistant:

TPZEigenSolver<TVar> &TPZEigenAnalysis::EigenSolver()
{
    const auto tmp = dynamic_cast<TPZEigenSolver<TVar>*>(fSolver);
    if(fSolver && !tmp){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible Solver type! Aborting\n";
        DebugStop();
    }
    return *tmp;
}